

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

QNetworkRequest __thiscall
QNetworkRequestFactoryPrivate::newRequest(QNetworkRequestFactoryPrivate *this,QUrl *url)

{
  long lVar1;
  QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
  rhs;
  QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
  lhs;
  QAnyStringView newValue;
  bool bVar2;
  Attribute *pAVar3;
  QStringBuilder<const_char_(&)[8],_const_QByteArray_&> *in_RSI;
  milliseconds in_RDI;
  long in_FS_OFFSET;
  QVariant *value;
  Attribute *attribute;
  QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&> *__range1;
  QNetworkRequest *request;
  const_key_value_iterator __end1;
  const_key_value_iterator __begin1;
  QHttpHeaders h;
  char Bearer [8];
  undefined4 uVar4;
  WellKnownHeader name;
  QAnyStringView *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  Attribute in_stack_ffffffffffffff1c;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  
  uVar4 = (undefined4)in_RDI.__r;
  name = (WellKnownHeader)((ulong)in_RDI.__r >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((totally_ordered_wrapper<QNetworkRequestPrivate_*> *)&(((QByteArray *)in_RDI.__r)->d).d)->ptr =
       (QNetworkRequestPrivate *)0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)in_RDI.__r);
  QNetworkRequest::setUrl((QNetworkRequest *)CONCAT44(name,uVar4),(QUrl *)in_RDI.__r);
  bVar2 = QSslConfiguration::isNull((QSslConfiguration *)in_stack_ffffffffffffff10);
  if (!bVar2) {
    QNetworkRequest::setSslConfiguration
              ((QNetworkRequest *)in_stack_ffffffffffffff10,(QSslConfiguration *)in_RSI);
  }
  QHttpHeaders::QHttpHeaders((QHttpHeaders *)CONCAT44(name,uVar4),(QHttpHeaders *)in_RDI.__r);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x326cfb);
  if (!bVar2) {
    ::operator+((char (*) [8])CONCAT44(name,uVar4),(QByteArray *)in_RDI.__r);
    QByteArray::QByteArray((QByteArray *)0x326d32);
    QAnyStringView::QAnyStringView<QStringBuilder<const_char_(&)[8],_const_QByteArray_&>,_true>
              (in_stack_ffffffffffffff10,in_RSI,
               (wrapped_t<QStringBuilder<const_char_(&)[8],_const_QByteArray_&>,_QByteArray> *)
               CONCAT44(name,uVar4));
    newValue.m_size = in_stack_ffffffffffffff68;
    newValue.field_0.m_data = in_stack_ffffffffffffff60.m_data;
    QHttpHeaders::replaceOrAppend((QHttpHeaders *)in_RSI,name,newValue);
    QByteArray::~QByteArray((QByteArray *)0x326d7e);
  }
  QNetworkRequest::setHeaders((QNetworkRequest *)CONCAT44(name,uVar4),(QHttpHeaders *)in_RDI.__r);
  QNetworkRequest::setTransferTimeout((QNetworkRequest *)0x326db3,in_RDI);
  QNetworkRequest::setPriority
            ((QNetworkRequest *)CONCAT44(name,uVar4),(Priority)((ulong)in_RDI.__r >> 0x20));
  QHash<QNetworkRequest::Attribute,_QVariant>::asKeyValueRange
            ((QHash<QNetworkRequest::Attribute,_QVariant> *)CONCAT44(name,uVar4));
  QtPrivate::QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&>::begin
            ((QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&> *)0x326e22);
  QtPrivate::QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&>::end
            ((QKeyValueRange<const_QHash<QNetworkRequest::Attribute,_QVariant>_&> *)0x326e5a);
  while (lhs.i.i.bucket._0_4_ = in_stack_ffffffffffffff18,
        lhs.i.i.d = (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)
                    in_stack_ffffffffffffff10, lhs.i.i.bucket._4_4_ = in_stack_ffffffffffffff1c,
        rhs.i.i.d._4_4_ = name, rhs.i.i.d._0_4_ = uVar4, rhs.i.i.bucket = (size_t)in_RSI,
        bVar2 = ::operator!=(lhs,rhs), bVar2) {
    QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
    ::operator*((QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
                 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pAVar3 = std::get<0ul,QNetworkRequest::Attribute_const&,QVariant_const&>
                       ((pair<const_QNetworkRequest::Attribute_&,_const_QVariant_&> *)0x326f0f);
    in_stack_ffffffffffffff18 = SUB84(pAVar3,0);
    in_stack_ffffffffffffff1c = (Attribute)((ulong)pAVar3 >> 0x20);
    in_stack_ffffffffffffff10 =
         (QAnyStringView *)
         std::get<1ul,QNetworkRequest::Attribute_const&,QVariant_const&>
                   ((pair<const_QNetworkRequest::Attribute_&,_const_QVariant_&> *)0x326f2d);
    QNetworkRequest::setAttribute
              ((QNetworkRequest *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff1c,
               (QVariant *)in_RSI);
    QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
    ::operator++((QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
                  *)CONCAT44(name,uVar4));
  }
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x326f6c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QNetworkRequestPrivate>)
         (QSharedDataPointer<QNetworkRequestPrivate>)in_RDI.__r;
}

Assistant:

QNetworkRequest QNetworkRequestFactoryPrivate::newRequest(const QUrl &url) const
{
    QNetworkRequest request;
    request.setUrl(url);
#if QT_CONFIG(ssl)
    if (!sslConfig.isNull())
        request.setSslConfiguration(sslConfig);
#endif
    auto h = headers;
    constexpr char Bearer[] = "Bearer ";
    if (!bearerToken.isEmpty())
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Authorization, Bearer + bearerToken);
    request.setHeaders(std::move(h));

    request.setTransferTimeout(transferTimeout);
    request.setPriority(priority);

    for (const auto &[attribute, value] : attributes.asKeyValueRange())
        request.setAttribute(attribute, value);

    return request;
}